

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::get_4(disp *this,int x,int y,int z,int t)

{
  string sStack_128;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ts<int>(&local_68,x);
  std::operator+(&local_c8,"get_4",&local_68);
  ts<int>(&local_e8,y);
  std::operator+(&local_a8,&local_c8,&local_e8);
  ts<int>(&local_108,z);
  std::operator+(&local_88,&local_a8,&local_108);
  ts<int>(&sStack_128,t);
  std::operator+(&local_48,&local_88,&sStack_128);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_128);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void get_4(int x,int y,int z,int t) { v_="get_4" + ts(x)+ts(y)+ts(z)+ts(t); }